

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * stb_sparse_ptr_matrix_get(stb_spmatrix *z,void *a,void *b,int create)

{
  stb__ptrpair k;
  stb__ptrpair k_00;
  void *local_48;
  void *data;
  stb__ptrpair t;
  int create_local;
  void *b_local;
  void *a_local;
  stb_spmatrix *z_local;
  
  k.b = b;
  k.a = a;
  local_48 = stb__spmatrix_get(z,k);
  if ((local_48 == (void *)0x0) && (create != 0)) {
    local_48 = stb_malloc_raw(z->arena,(long)z->val_size);
    if (local_48 == (void *)0x0) {
      return (void *)0x0;
    }
    memset(local_48,0,(long)z->val_size);
    k_00.b = b;
    k_00.a = a;
    stb__spmatrix_add(z,k_00,local_48);
  }
  return local_48;
}

Assistant:

void *stb_sparse_ptr_matrix_get(stb_spmatrix *z, void *a, void *b, int create)
{
   stb__ptrpair t = { a,b };
   void *data = stb__spmatrix_get(z, t);
   if (!data && create) {
      data = stb_malloc_raw(z->arena, z->val_size);
      if (!data) return NULL;
      memset(data, 0, z->val_size);
      stb__spmatrix_add(z, t, data);
   }
   return data;
}